

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc_compat.c
# Opt level: O2

int main(int argc,char **argv)

{
  ulong uVar1;
  char cVar2;
  int iVar3;
  FILE *pFVar4;
  ulong __n;
  void *__ptr;
  size_t sVar5;
  ulong uVar6;
  char *__ptr_00;
  ulong uVar7;
  uchar *pc;
  void *__dest;
  size_t sStack_60;
  void *p;
  
  if (argc - 3U < 0xfffffffe) {
    fwrite("wrong number of arguments:\nusage: <program> [<input-filename>]\n",0x3f,1,_stderr);
    exit(1);
  }
  if (argc == 2) {
    filename = argv[1];
  }
  pFVar4 = fopen(filename,"rb");
  __ptr = (void *)0x0;
  uVar7 = 0;
  if (pFVar4 == (FILE *)0x0) {
LAB_00102978:
    free(__ptr);
    __ptr = (void *)0x0;
    __n = uVar7;
  }
  else {
    __ptr = (void *)0x0;
    fseek(pFVar4,0,2);
    __n = ftell(pFVar4);
    uVar7 = 0;
    if ((long)__n < 0) {
LAB_00102970:
      fclose(pFVar4);
      goto LAB_00102978;
    }
    uVar7 = __n;
    if (0x400 < __n) {
LAB_0010296a:
      __ptr = (void *)0x0;
      goto LAB_00102970;
    }
    rewind(pFVar4);
    __ptr = malloc(__n + (__n == 0));
    if (__ptr == (void *)0x0) goto LAB_0010296a;
    uVar1 = 0;
    do {
      uVar6 = uVar1;
      sVar5 = fread((void *)((long)__ptr + uVar6),1,__n - uVar6,pFVar4);
      uVar1 = sVar5 + uVar6;
    } while (sVar5 != 0);
    if (__n != uVar6) goto LAB_00102970;
    fclose(pFVar4);
  }
  p = (void *)0x0;
  iVar3 = posix_memalign(&p,0x100,__n + 0xff & 0xffffffffffffff00);
  __dest = p;
  if (p != (void *)0x0 && iVar3 != 0) {
    free(p);
    __dest = (void *)0x0;
  }
  memcpy(__dest,__ptr,__n);
  free(__ptr);
  pFVar4 = _stderr;
  if (__dest == (void *)0x0) {
    fprintf(_stderr,"could not read binary test file: %s\n",filename);
    return -1;
  }
  fprintf(_stderr,"%s:\n","monsterdata_test.mon");
  for (uVar7 = 0; (__n & 0xffffffff) != uVar7; uVar7 = uVar7 + 1) {
    if ((uVar7 & 0xf) == 0) {
      if (uVar7 != 0) {
        fprintf(pFVar4,"  |%s|\n",&p);
      }
      fprintf(pFVar4,"%08x ",uVar7 & 0xffffffff);
    }
    else if ((uVar7 & 7) == 0) {
      fputc(0x20,pFVar4);
    }
    fprintf(pFVar4," %02x",(ulong)*(byte *)((long)__dest + uVar7));
    cVar2 = *(char *)((long)__dest + uVar7);
    if ((byte)(cVar2 + 0x81U) < 0xa1) {
      cVar2 = '.';
    }
    *(char *)((long)&p + (ulong)((uint)uVar7 & 0xf)) = cVar2;
    *(undefined1 *)((uVar7 & 0xf) + 1 + (long)&p) = 0;
  }
  if (0xfffffff7 < ((uint)__n & 0xf) - 9) {
    fputc(0x20,pFVar4);
  }
  for (uVar7 = __n & 0xffffffff; (uVar7 & 0xf) != 0; uVar7 = (ulong)((int)uVar7 + 1)) {
    fwrite("   ",3,1,pFVar4);
  }
  fprintf(pFVar4,"  |%s|\n",&p);
  iVar3 = flatcc_verify_table_as_root(__dest,__n,"MONS",MyGame_Example_Monster_verify_table);
  if (iVar3 == 0) {
    iVar3 = flatcc_verify_table_as_root(__dest,__n,"MONS",MyGame_Example_Monster_verify_table);
    if (iVar3 == 0) {
      iVar3 = verify_monster(__dest);
      goto LAB_00102b73;
    }
    __ptr_00 = "could not verify foreign monster file with default identifier\n";
    sStack_60 = 0x3e;
  }
  else {
    __ptr_00 = "could not verify foreign monster file\n";
    sStack_60 = 0x26;
  }
  fwrite(__ptr_00,sStack_60,1,_stderr);
  iVar3 = -1;
LAB_00102b73:
  free(__dest);
  return iVar3;
}

Assistant:

int main(int argc, char *argv[])
{
    int ret;
    size_t size;
    void *buffer, *raw_buffer;

    if (argc != 1 && argc != 2) {
        fprintf(stderr, usage);
        exit(1);
    }
    if (argc == 2) {
        filename = argv[1];
    }

    raw_buffer = readfile(filename, 1024, &size);
    buffer = aligned_alloc(256, align_up(256, size));
    memcpy(buffer, raw_buffer, size);
    free(raw_buffer);

    if (!buffer) {
        fprintf(stderr, "could not read binary test file: %s\n", filename);
        return -1;
    }
    hexdump("monsterdata_test.mon", buffer, size, stderr);
    /*
     * Not automated, but verifying size - 3 fails as expected because the last
     * object in the file is a string, and the zero termination fails.
     * size - 1 and size - 2 verifies because the buffers contains
     * padding. Note that `flatcc` does not pad at the end beyond whatever
     * is stored (normally a vtable), but this is generated with `flatc
     * v1.1`.
     */
    if (flatcc_verify_ok != ns(Monster_verify_as_root_with_identifier(buffer, size, "MONS"))) {
#if FLATBUFFERS_PROTOCOL_IS_BE
        fprintf(stderr, "flatc golden reference buffer was correctly rejected by flatcc verificiation\n"
                "because flatc is little endian and flatcc has been compiled for big endian protocol format\n");
        ret = 0;
        goto done;
#else
        fprintf(stderr, "could not verify foreign monster file\n");
        ret = -1;
        goto done;
#endif
    }

#if FLATBUFFERS_PROTOCOL_IS_BE
    fprintf(stderr, "flatcc compiled with big endian protocol failed to reject reference little endian buffer\n");
    ret = -1;
    goto done;
#else
    if (flatcc_verify_ok != ns(Monster_verify_as_root(buffer, size))) {
        fprintf(stderr, "could not verify foreign monster file with default identifier\n");
        ret = -1;
        goto done;
    }
    ret = verify_monster(buffer);
#endif

done:
    aligned_free(buffer);
    return ret;
}